

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O1

bool __thiscall QGuiApplicationPrivate::lastWindowClosed(QGuiApplicationPrivate *this)

{
  char cVar1;
  char cVar2;
  iterator iVar3;
  iterator iVar4;
  QWindowPrivate *pQVar5;
  long in_FS_OFFSET;
  QList<QWindow_*> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QGuiApplication::topLevelWindows();
  iVar3 = QList<QWindow_*>::begin(&local_40);
  iVar4 = QList<QWindow_*>::end(&local_40);
  for (; iVar3.i != iVar4.i; iVar3.i = iVar3.i + 1) {
    pQVar5 = qt_window_private(*iVar3.i);
    cVar1 = (**(code **)(*(long *)pQVar5 + 0x50))(pQVar5);
    cVar2 = '\x03';
    if (cVar1 != '\0') {
      cVar2 = (**(code **)(*(long *)pQVar5 + 0x58))(pQVar5);
    }
    if ((cVar2 != '\x03') && (cVar2 != '\0')) break;
  }
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar3.i == iVar4.i;
  }
  __stack_chk_fail();
}

Assistant:

bool QGuiApplicationPrivate::lastWindowClosed() const
{
    for (auto *window : QGuiApplication::topLevelWindows()) {
        auto *windowPrivate = qt_window_private(window);
        if (!windowPrivate->participatesInLastWindowClosed())
            continue;

        if (windowPrivate->treatAsVisible())
            return false;
     }

     return true;
}